

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void compile_gram(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *grams,uint32_t *dest,char *descriptor,bool quiet)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  char *pcVar5;
  ostream *poVar6;
  long lVar7;
  byte *pbVar8;
  byte in_CL;
  char *in_RDX;
  long in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int n_1;
  size_t j;
  int n;
  string ngram;
  size_t i;
  ulong local_60;
  string local_48 [32];
  ulong local_28;
  byte local_19;
  char *local_18;
  long local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_28 = 0; uVar1 = local_28,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI), uVar1 < sVar3; local_28 = local_28 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](in_RDI,local_28);
    std::__cxx11::string::string(local_48,(string *)pvVar4);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    iVar2 = isdigit((int)*pcVar5);
    if (iVar2 == 0) {
      lVar7 = std::__cxx11::string::size();
      if (lVar7 == 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "You must specify the namespace index before the n");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        lVar7 = std::__cxx11::string::c_str();
        iVar2 = atoi((char *)(lVar7 + 1));
        lVar7 = local_10;
        pbVar8 = (byte *)std::__cxx11::string::c_str();
        *(int *)(lVar7 + (ulong)*pbVar8 * 4) = iVar2;
        if ((local_19 & 1) == 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Generating ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
          poVar6 = std::operator<<(poVar6,"-");
          poVar6 = std::operator<<(poVar6,local_18);
          poVar6 = std::operator<<(poVar6," for ");
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
          poVar6 = std::operator<<(poVar6,*pcVar5);
          poVar6 = std::operator<<(poVar6," namespaces.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iVar2 = atoi(pcVar5);
      if ((local_19 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Generating ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
        poVar6 = std::operator<<(poVar6,"-");
        poVar6 = std::operator<<(poVar6,local_18);
        poVar6 = std::operator<<(poVar6," for all namespaces.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      for (local_60 = 0; local_60 < 0x100; local_60 = local_60 + 1) {
        *(int *)(local_10 + local_60 * 4) = iVar2;
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void compile_gram(vector<string> grams, uint32_t* dest, char* descriptor, bool quiet)
{
  for (size_t i = 0; i < grams.size(); i++)
  {
    string ngram = grams[i];
    if (isdigit(ngram[0]))
    {
      int n = atoi(ngram.c_str());
      if (!quiet)
        cerr << "Generating " << n << "-" << descriptor << " for all namespaces." << endl;
      for (size_t j = 0; j < 256; j++) dest[j] = n;
    }
    else if (ngram.size() == 1)
      cout << "You must specify the namespace index before the n" << endl;
    else
    {
      int n = atoi(ngram.c_str() + 1);
      dest[(uint32_t)(unsigned char)*ngram.c_str()] = n;
      if (!quiet)
        cerr << "Generating " << n << "-" << descriptor << " for " << ngram[0] << " namespaces." << endl;
    }
  }
}